

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O2

void __thiscall D2xNvmFlash::command(D2xNvmFlash *this,uint8_t cmd)

{
  uint32_t uVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000031;
  
  waitReady(this);
  writeReg(this,'\0',(uint)CONCAT71(in_register_00000031,cmd) | 0xa500);
  waitReady(this);
  uVar1 = readReg(this,'\x14');
  if ((uVar1 & 2) == 0) {
    return;
  }
  writeReg(this,'\x14',2);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_001177c8;
  __cxa_throw(puVar2,&FlashCmdError::typeinfo,std::exception::~exception);
}

Assistant:

void
D2xNvmFlash::command(uint8_t cmd)
{
    waitReady();

    writeReg(NVM_REG_CTRLA, CMDEX_KEY | cmd);

    waitReady();

    if (readReg(NVM_REG_INTFLAG) & 0x2)
    {
        // Clear the error bit
        writeReg(NVM_REG_INTFLAG, 0x2);
        throw FlashCmdError();
    }
}